

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recv.c
# Opt level: O1

yrmcds_error yrmcds_recv(yrmcds *c,yrmcds_response *r)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  long *plVar6;
  ushort uVar7;
  yrmcds_error yVar8;
  void *pvVar9;
  char *pcVar10;
  ssize_t sVar11;
  int *piVar12;
  char *pcVar13;
  long lVar14;
  ulong *puVar15;
  ulong uVar16;
  char cVar17;
  yrmcds_error yVar18;
  uint uVar19;
  uint64_t uVar20;
  uint32_t uVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  char *pcVar25;
  ulong uVar26;
  size_t sVar27;
  bool bVar28;
  
  if (r == (yrmcds_response *)0x0 || c == (yrmcds *)0x0) {
    return YRMCDS_BAD_ARGUMENT;
  }
  yVar18 = YRMCDS_PROTOCOL_ERROR;
  if (c->invalid != 0) {
    return YRMCDS_PROTOCOL_ERROR;
  }
  sVar5 = c->last_size;
  if (sVar5 != 0) {
    sVar27 = c->used - sVar5;
    if (sVar27 != 0) {
      memmove(c->recvbuf,c->recvbuf + sVar5,sVar27);
    }
    c->used = sVar27;
    yVar18 = YRMCDS_OK;
    c->last_size = 0;
    free(c->decompressed);
    c->decompressed = (char *)0x0;
  }
  if (c->text_mode != 0) {
LAB_00122223:
    sVar27 = c->used;
    if (sVar27 != 0) {
      pcVar10 = c->recvbuf;
      pvVar9 = memchr(pcVar10,10,sVar27);
      if (pvVar9 != (void *)0x0) {
        if (((long)pvVar9 - (long)pcVar10 < 2) || (*(char *)((long)pvVar9 + -1) != '\r'))
        goto LAB_00122754;
        pcVar25 = (char *)((long)pvVar9 + -1);
        uVar26 = (long)pcVar25 - (long)pcVar10;
        r->data_len = 0;
        r->value = 0;
        r->key_len = 0;
        r->data = (char *)0x0;
        *(undefined8 *)&r->flags = 0;
        r->key = (char *)0x0;
        r->status = YRMCDS_STATUS_OK;
        r->command = YRMCDS_CMD_GET;
        r->cas_unique = 0;
        *(undefined8 *)r = 0;
        r->length = 0;
        uVar21 = c->rserial + 1;
        c->rserial = uVar21;
        r->serial = uVar21;
        r->length = uVar26 + 2;
        r->status = YRMCDS_STATUS_OK;
        r->command = YRMCDS_CMD_BOTTOM;
        switch(uVar26) {
        case 2:
          if (*(short *)c->recvbuf == 0x4b4f) goto LAB_00122a31;
          switch(uVar26) {
          case 3:
            goto switchD_001223ef_caseD_3;
          case 5:
            goto switchD_001223ef_caseD_5;
          case 6:
            goto switchD_001223ef_caseD_6;
          case 7:
            goto switchD_001223ef_caseD_7;
          case 9:
            goto switchD_001223ef_caseD_9;
          case 10:
            goto switchD_001223ef_caseD_a;
          }
          break;
        case 3:
switchD_001223ef_caseD_3:
          if ((char)*(short *)((long)c->recvbuf + 2) == 'D' && *(short *)c->recvbuf == 0x4e45)
          goto LAB_00122855;
          switch(uVar26) {
          case 5:
            goto switchD_001223ef_caseD_5;
          case 6:
            goto switchD_001223ef_caseD_6;
          case 7:
            goto switchD_001223ef_caseD_7;
          case 9:
            goto switchD_001223ef_caseD_9;
          case 10:
            goto switchD_001223ef_caseD_a;
          }
          break;
        case 5:
switchD_001223ef_caseD_5:
          if ((char)*(int *)((long)c->recvbuf + 4) == 'R' && *(int *)c->recvbuf == 0x4f525245) {
            r->status = YRMCDS_STATUS_UNKNOWNCOMMAND;
            goto LAB_00122a31;
          }
          switch(uVar26) {
          case 6:
            goto switchD_001223ef_caseD_6;
          case 7:
            goto switchD_001223ef_caseD_7;
          case 9:
            goto switchD_001223ef_caseD_9;
          case 10:
            goto switchD_001223ef_caseD_a;
          }
          break;
        case 6:
switchD_001223ef_caseD_6:
          piVar12 = (int *)c->recvbuf;
          if ((short)piVar12[1] == 0x4445 && *piVar12 == 0x524f5453) goto LAB_00122a31;
          if ((short)piVar12[1] == 0x5354 && *piVar12 == 0x53495845) {
            r->status = YRMCDS_STATUS_EXISTS;
            goto LAB_00122a31;
          }
          if (uVar26 == 10) goto switchD_001223ef_caseD_a;
          if (uVar26 == 9) goto switchD_001223ef_caseD_9;
          if (uVar26 == 7) goto switchD_001223ef_caseD_7;
          break;
        case 7:
switchD_001223ef_caseD_7:
          piVar12 = (int *)c->recvbuf;
          if ((*(int *)((long)piVar12 + 3) == 0x44455445 && *piVar12 == 0x454c4544) ||
             (*(int *)((long)piVar12 + 3) == 0x44454843 && *piVar12 == 0x43554f54))
          goto LAB_00122a31;
          if (uVar26 == 10) goto switchD_001223ef_caseD_a;
          if (uVar26 == 9) goto switchD_001223ef_caseD_9;
          break;
        case 9:
switchD_001223ef_caseD_9:
          if ((char)*(long *)((long)c->recvbuf + 8) == 'D' &&
              *(long *)c->recvbuf == 0x4e554f465f544f4e) {
LAB_00122855:
            r->status = YRMCDS_STATUS_NOTFOUND;
            goto LAB_00122a31;
          }
          if (uVar26 == 10) goto switchD_001223ef_caseD_a;
          break;
        case 10:
switchD_001223ef_caseD_a:
          if ((short)*(long *)((long)c->recvbuf + 8) == 0x4445 &&
              *(long *)c->recvbuf == 0x524f54535f544f4e) {
            r->status = YRMCDS_STATUS_NOTSTORED;
            goto LAB_00122a31;
          }
        }
        if ((pcVar25 != pcVar10) && (pcVar10 = c->recvbuf, (byte)(*pcVar10 - 0x30U) < 10))
        goto LAB_00122589;
        if ((8 < uVar26) && (plVar6 = (long *)c->recvbuf, *plVar6 == 0x204e4f4953524556)) {
          r->data_len = uVar26 - 8;
          r->data = (char *)(plVar6 + 1);
          goto LAB_00122a31;
        }
        if ((uVar26 < 7) ||
           (piVar12 = (int *)c->recvbuf, (short)piVar12[1] != 0x2045 || *piVar12 != 0x554c4156))
        goto LAB_00122a0a;
        pcVar10 = (char *)((long)piVar12 + 5);
        do {
          piVar12 = (int *)((long)piVar12 + 1);
          pcVar13 = pcVar10 + 1;
          pcVar10 = pcVar10 + 1;
        } while (*pcVar13 == ' ');
        iVar24 = 0xb;
        yVar8 = yVar18;
        if (pcVar10 == pcVar25) goto LAB_001229fc;
        pvVar9 = memchr(pcVar10,0x20,(long)pvVar9 + (-6 - (long)piVar12));
        if (pvVar9 == (void *)0x0) {
          iVar24 = 0xb;
        }
        else {
          r->key = pcVar10;
          r->key_len = (long)pvVar9 + (-5 - (long)piVar12);
          lVar14 = (long)pvVar9 + -1;
          do {
            cVar17 = *(char *)(lVar14 + 1);
            lVar14 = lVar14 + 1;
          } while (cVar17 == ' ');
          uVar21 = 0;
          iVar24 = 0xb;
          if ((byte)(cVar17 - 0x30U) < 10) {
            uVar21 = 0;
            do {
              uVar21 = (uint)(byte)(cVar17 - 0x30) + uVar21 * 10;
              cVar17 = *(char *)(lVar14 + 1);
              lVar14 = lVar14 + 1;
            } while ((byte)(cVar17 - 0x30U) < 10);
            bVar28 = cVar17 == ' ';
          }
          else {
            bVar28 = false;
          }
          if (bVar28) {
            r->flags = uVar21;
            lVar14 = lVar14 + -1;
            do {
              cVar17 = *(char *)(lVar14 + 1);
              lVar14 = lVar14 + 1;
            } while (cVar17 == ' ');
            uVar23 = 0;
            while ((byte)(cVar17 - 0x30U) < 10) {
              uVar23 = (ulong)(byte)(cVar17 - 0x30) + uVar23 * 10;
              pcVar10 = (char *)(lVar14 + 1);
              lVar14 = lVar14 + 1;
              cVar17 = *pcVar10;
            }
            if (uVar23 < 0x3200001) {
              pcVar10 = (char *)(lVar14 + -1);
              do {
                pcVar25 = pcVar10 + 1;
                pcVar10 = pcVar10 + 1;
              } while (*pcVar25 == ' ');
              if (0xf5 < (byte)(*pcVar25 - 0x3aU)) {
                do {
                  cVar17 = *pcVar10;
                  pcVar10 = pcVar10 + 1;
                } while (cVar17 == ' ');
                uVar20 = 0;
                while ((byte)(cVar17 - 0x30U) < 10) {
                  uVar20 = (ulong)(byte)(cVar17 - 0x30) + uVar20 * 10;
                  cVar17 = *pcVar10;
                  pcVar10 = pcVar10 + 1;
                }
                uVar16 = uVar26 + uVar23 + 9;
                do {
                  if (uVar16 <= c->used) {
                    pcVar10 = c->recvbuf + uVar26 + 2;
                    if (*(int *)(pcVar10 + uVar23 + 3) != 0xa0d444e ||
                        *(int *)(pcVar10 + uVar23) != 0x4e450a0d) goto LAB_00122918;
                    r->length = uVar16;
                    r->flags = uVar21;
                    r->data = pcVar10;
                    r->data_len = uVar23;
                    r->cas_unique = uVar20;
                    iVar24 = 4;
                    yVar8 = yVar18;
                    break;
                  }
                  yVar8 = recv_data(c);
                  iVar24 = 1;
                } while (yVar8 == YRMCDS_OK);
              }
            }
            else {
LAB_00122918:
              c->invalid = 1;
              iVar24 = 1;
              yVar8 = YRMCDS_PROTOCOL_ERROR;
            }
          }
        }
LAB_001229fc:
        if (iVar24 != 4) {
          if (iVar24 != 0xb) {
            return yVar8;
          }
LAB_00122a0a:
          r->status = YRMCDS_STATUS_OTHER;
          fprintf(_stderr,"[libyrmcds] unknown response: %.*s\n",uVar26 & 0xffffffff,c->recvbuf);
        }
        goto LAB_00122a31;
      }
    }
    if (c->capacity - sVar27 < 0x40000) {
      sVar27 = c->capacity * 2;
      pcVar10 = (char *)realloc(c->recvbuf,sVar27);
      if (pcVar10 != (char *)0x0) {
        c->recvbuf = pcVar10;
        c->capacity = sVar27;
        goto LAB_00122277;
      }
      yVar8 = YRMCDS_OUT_OF_MEMORY;
    }
    else {
LAB_00122277:
      do {
        bVar28 = false;
        sVar11 = recv(c->sock,c->recvbuf + c->used,0x40000,0);
        if (sVar11 != -1) {
          if (sVar11 == 0) {
            yVar8 = YRMCDS_DISCONNECTED;
          }
          else {
            c->used = c->used + sVar11;
            yVar8 = YRMCDS_OK;
            bVar28 = true;
          }
          goto LAB_001222c4;
        }
        piVar12 = __errno_location();
      } while (*piVar12 == 4);
      yVar8 = YRMCDS_SYSTEM_ERROR;
    }
    bVar28 = false;
LAB_001222c4:
    if (!bVar28) {
      return yVar8;
    }
    goto LAB_00122223;
  }
  while (c->used < 0x18) {
    if (c->capacity - c->used < 0x40000) {
      sVar27 = c->capacity * 2;
      pcVar10 = (char *)realloc(c->recvbuf,sVar27);
      if (pcVar10 != (char *)0x0) {
        c->recvbuf = pcVar10;
        c->capacity = sVar27;
        goto LAB_00122313;
      }
      yVar18 = YRMCDS_OUT_OF_MEMORY;
      bVar28 = true;
    }
    else {
LAB_00122313:
      do {
        sVar11 = recv(c->sock,c->recvbuf + c->used,0x40000,0);
        bVar28 = true;
        if (sVar11 != -1) {
          yVar18 = YRMCDS_DISCONNECTED;
          if (sVar11 != 0) {
            c->used = c->used + sVar11;
            bVar28 = false;
            yVar18 = YRMCDS_OK;
          }
          goto LAB_0012235f;
        }
        piVar12 = __errno_location();
      } while (*piVar12 == 4);
      yVar18 = YRMCDS_SYSTEM_ERROR;
    }
LAB_0012235f:
    if (bVar28) {
      return yVar18;
    }
  }
  if (*c->recvbuf == -0x7f) {
    uVar22 = *(uint *)(c->recvbuf + 8);
    uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
    if (uVar22 < 0x3200001) {
      uVar26 = (ulong)(uVar22 + 0x18);
      while (c->used < uVar26) {
        if (c->capacity - c->used < 0x40000) {
          sVar27 = c->capacity * 2;
          pcVar10 = (char *)realloc(c->recvbuf,sVar27);
          if (pcVar10 != (char *)0x0) {
            c->recvbuf = pcVar10;
            c->capacity = sVar27;
            goto LAB_0012261e;
          }
          yVar18 = YRMCDS_OUT_OF_MEMORY;
        }
        else {
LAB_0012261e:
          do {
            bVar28 = false;
            sVar11 = recv(c->sock,c->recvbuf + c->used,0x40000,0);
            if (sVar11 != -1) {
              if (sVar11 == 0) {
                yVar18 = YRMCDS_DISCONNECTED;
              }
              else {
                c->used = c->used + sVar11;
                yVar18 = YRMCDS_OK;
                bVar28 = true;
              }
              goto LAB_0012266d;
            }
            piVar12 = __errno_location();
          } while (*piVar12 == 4);
          yVar18 = YRMCDS_SYSTEM_ERROR;
        }
        bVar28 = false;
LAB_0012266d:
        if (!bVar28) {
          return yVar18;
        }
      }
      pcVar10 = c->recvbuf;
      uVar3 = *(ushort *)(pcVar10 + 2);
      uVar7 = uVar3 << 8 | uVar3 >> 8;
      bVar1 = pcVar10[4];
      uVar19 = (uint)uVar7 + (uint)bVar1;
      if (uVar19 <= uVar22) {
        pcVar13 = pcVar10 + (ulong)bVar1 + 0x18;
        r->length = uVar26;
        bVar2 = pcVar10[1];
        r->command = (uint)bVar2;
        pcVar25 = (char *)0x0;
        if (uVar3 != 0) {
          pcVar25 = pcVar13;
        }
        r->key = pcVar25;
        r->key_len = (ulong)uVar7;
        uVar3 = *(ushort *)(pcVar10 + 6);
        r->status = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
        r->serial = *(uint32_t *)(pcVar10 + 0xc);
        pcVar10 = c->recvbuf;
        uVar23 = *(ulong *)(pcVar10 + 0x10);
        r->cas_unique =
             uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
             (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
             (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 | (uVar23 & 0xff00) << 0x28 |
             uVar23 << 0x38;
        r->flags = 0;
        if ((ulong)bVar1 != 0) {
          if (bVar1 != 4) goto LAB_00122754;
          uVar4 = *(uint *)(pcVar10 + 0x18);
          r->flags = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
          ;
        }
        if (uVar3 != 0 || 1 < bVar2 - YRMCDS_CMD_INCREMENT) {
          puVar15 = (ulong *)(pcVar13 + uVar7);
          if (uVar22 == uVar19) {
            puVar15 = (ulong *)0x0;
          }
          r->value = 0;
          r->data = (char *)puVar15;
          r->data_len = (ulong)(uVar22 - uVar19);
          c->last_size = uVar26;
          return YRMCDS_OK;
        }
        r->data = (char *)0x0;
        r->data_len = 0;
        if (uVar22 - uVar19 == 8) {
          uVar23 = *(ulong *)(pcVar13 + uVar7);
          r->value = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                     (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                     (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                     (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
          c->last_size = uVar26;
          return YRMCDS_OK;
        }
      }
    }
  }
LAB_00122754:
  c->invalid = 1;
  return YRMCDS_PROTOCOL_ERROR;
LAB_00122589:
  do {
    cVar17 = *pcVar10;
    pcVar10 = pcVar10 + 1;
  } while (cVar17 == ' ');
  if ((byte)(cVar17 - 0x30U) < 10) {
    uVar20 = 0;
    do {
      uVar20 = (ulong)(byte)(cVar17 - 0x30) + uVar20 * 10;
      cVar17 = *pcVar10;
      pcVar10 = pcVar10 + 1;
    } while ((byte)(cVar17 - 0x30U) < 10);
  }
  else {
    uVar20 = 0;
  }
  r->value = uVar20;
LAB_00122a31:
  c->last_size = r->length;
  return YRMCDS_OK;
}

Assistant:

yrmcds_error yrmcds_recv(yrmcds* c, yrmcds_response* r) {
    if( c == NULL || r == NULL )
        return YRMCDS_BAD_ARGUMENT;
    if( c->invalid )
        return YRMCDS_PROTOCOL_ERROR;

    if( c->last_size > 0 ) {
        size_t remain = c->used - c->last_size;
        if( remain > 0 )
            memmove(c->recvbuf, c->recvbuf + c->last_size, remain);
        c->used = remain;
        c->last_size = 0;
        free(c->decompressed);
        c->decompressed = NULL;
    }

    if( c->text_mode ) {
        return text_recv(c, r);
    }

    while( c->used < BINARY_HEADER_SIZE ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }

    if( *c->recvbuf != '\x81' ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    uint32_t total_len = ntoh32(c->recvbuf + 8);
    if( total_len > MAX_CAPACITY ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    while( c->used < (BINARY_HEADER_SIZE + total_len) ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }

    uint16_t key_len = ntoh16(c->recvbuf + 2);
    uint8_t extras_len = *(unsigned char*)(c->recvbuf + 4);
    if( total_len < (key_len + extras_len) ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }

    const char* pkey = c->recvbuf + (BINARY_HEADER_SIZE + extras_len);
    r->length = BINARY_HEADER_SIZE + total_len;
    r->command = *(unsigned char*)(c->recvbuf + 1);
    r->key = key_len ? pkey : NULL;
    r->key_len = key_len;
    r->status = ntoh16(c->recvbuf + 6);
    memcpy(&(r->serial), c->recvbuf + 12, 4);
    r->cas_unique = ntoh64(c->recvbuf + 16);
    r->flags = 0;
    if( extras_len > 0 ) {
        if( extras_len != 4 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->flags = ntoh32(c->recvbuf + BINARY_HEADER_SIZE);
    }

    size_t data_len = total_len - key_len - extras_len;
    const char* pdata = pkey + key_len;

    if( (r->command == YRMCDS_CMD_INCREMENT ||
         r->command == YRMCDS_CMD_DECREMENT) &&
        (r->status == YRMCDS_STATUS_OK) ) {
        r->data = NULL;
        r->data_len = 0;
        if( data_len != 8 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->value = ntoh64(pdata);
        c->last_size = r->length;
        return YRMCDS_OK;
    }
    r->value = 0;
    r->data = data_len ? pdata : NULL;
    r->data_len = data_len;

#ifdef LIBYRMCDS_USE_LZ4
    if( c->compress_size && (r->flags & YRMCDS_FLAG_COMPRESS) ) {
        if( data_len == 0 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->flags &= ~(uint32_t)YRMCDS_FLAG_COMPRESS;
        uint32_t decompress_size = ntoh32(pdata);
        if( UINT32_MAX > INT_MAX ) {
            if( decompress_size > INT_MAX ) {
                c->invalid = 1;
                return YRMCDS_PROTOCOL_ERROR;
            }
        }
        c->decompressed = (char*)malloc(decompress_size);
        if( c->decompressed == NULL )
            return YRMCDS_OUT_OF_MEMORY;
        int d = LZ4_decompress_safe(pdata + sizeof(uint32_t),
                                    c->decompressed,
                                    (int)(data_len - sizeof(uint32_t)),
                                    (int)decompress_size);
        if( d != decompress_size ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->data = c->decompressed;
        r->data_len = decompress_size;
    }
#endif // LIBYRMCDS_USE_LZ4

    c->last_size = r->length;
    return YRMCDS_OK;
}